

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O1

uint32 readle32(void)

{
  uint in_EAX;
  ssize_t sVar1;
  uint32 retval;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  if (io_failure == '\0') {
    sVar1 = read(logfd,(void *)((long)&uStack_8 + 4),4);
    if (sVar1 != 4) {
      IO_READ_FAIL((uint)(-1 < sVar1));
    }
  }
  return uStack_8._4_4_;
}

Assistant:

static uint32 readle32(void)
{
    uint32 retval = 0;
    if (!io_failure) {
        const ssize_t br = read(logfd, &retval, sizeof (retval));
        if (br != ((ssize_t) sizeof (retval))) {
            IO_READ_FAIL(br >= 0);
        }
    }
    return swap32(retval);
}